

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O2

void __thiscall
sznet::MinHeap<sznet::Timer>::shiftDown_(MinHeap<sznet::Timer> *this,uint32_t hole_index,Timer *e)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Timer **ppTVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = (ulong)hole_index;
  while( true ) {
    iVar2 = (int)uVar5;
    uVar1 = iVar2 * 2 + 2;
    if (this->m_size < uVar1) break;
    if (uVar1 == this->m_size) {
      uVar6 = iVar2 * 2 | 1;
      uVar7 = (ulong)uVar6;
    }
    else {
      uVar6 = iVar2 * 2 | 1;
      iVar3 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar1],this->m_ptrArr[uVar6]);
      uVar7 = (ulong)uVar6;
      if (iVar3 != 1) {
        uVar7 = (ulong)uVar1;
        uVar6 = uVar1;
      }
    }
    iVar3 = (*this->m_pCmpFunc)(e,this->m_ptrArr[uVar7]);
    ppTVar4 = this->m_ptrArr;
    if (iVar3 == -1) goto LAB_0012cfa7;
    ppTVar4[uVar5] = ppTVar4[uVar7];
    (this->m_ptrArr[uVar5]->super_MinHeaBaseElem).min_heap_idx = iVar2;
    uVar5 = (ulong)uVar6;
  }
  ppTVar4 = this->m_ptrArr;
LAB_0012cfa7:
  ppTVar4[uVar5] = e;
  (this->m_ptrArr[uVar5]->super_MinHeaBaseElem).min_heap_idx = iVar2;
  return;
}

Assistant:

void shiftDown_(uint32_t hole_index, T* e)
	{
		// 用于记录值较小的子结点的下标
		uint32_t min_child_index = rightChild(hole_index);
		// min_child_index小于m_size的情况说明有左孩子也有右孩子
		// min_child_index等于m_size的情况说明只有左孩子没有右孩子
		// min_child_index大于m_size的情况说明没有左孩子也没有右孩子
		while (min_child_index <= m_size)
		{
			// 没有右孩子 或者 左孩子小于右孩子
			if (min_child_index == m_size || m_pCmpFunc(m_ptrArr[min_child_index], m_ptrArr[min_child_index - 1]) == 1)
			{
				--min_child_index;
			}
			// 如果待放入的节点e比删除节点的左右孩子中较小的还小，符合性质，结束
			if (m_pCmpFunc(e, m_ptrArr[min_child_index]) == -1)
			{
				break;
			}
			// 继续向下找合适的位置
			m_ptrArr[hole_index] = m_ptrArr[min_child_index];
			m_ptrArr[hole_index]->min_heap_idx = hole_index;
			hole_index = min_child_index;
			min_child_index = rightChild(hole_index);
		}
		// 合适位置
		m_ptrArr[hole_index] = e;
		m_ptrArr[hole_index]->min_heap_idx = hole_index;
	}